

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

int io_lines(lua_State *L)

{
  int iVar1;
  char *__filename;
  FILE **ppFVar2;
  FILE *pFVar3;
  FILE **pf;
  char *filename;
  lua_State *L_local;
  
  iVar1 = lua_type(L,1);
  if (iVar1 < 1) {
    lua_rawgeti(L,-0x2711,1);
    L_local._4_4_ = f_lines(L);
  }
  else {
    __filename = luaL_checklstring(L,1,(size_t *)0x0);
    ppFVar2 = newfile(L);
    pFVar3 = fopen(__filename,"r");
    *ppFVar2 = (FILE *)pFVar3;
    if (*ppFVar2 == (FILE *)0x0) {
      fileerror(L,1,__filename);
    }
    iVar1 = lua_gettop(L);
    aux_lines(L,iVar1,1);
    L_local._4_4_ = 1;
  }
  return L_local._4_4_;
}

Assistant:

static int io_lines(lua_State*L){
if(lua_isnoneornil(L,1)){
lua_rawgeti(L,(-10001),1);
return f_lines(L);
}
else{
const char*filename=luaL_checkstring(L,1);
FILE**pf=newfile(L);
*pf=fopen(filename,"r");
if(*pf==NULL)
fileerror(L,1,filename);
aux_lines(L,lua_gettop(L),1);
return 1;
}
}